

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

Am_Value __thiscall Input_Char_Support::From_String(Input_Char_Support *this,char *string)

{
  char *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Value AVar2;
  Am_Input_Char local_24 [2];
  Am_Input_Char ch;
  char *string_local;
  Input_Char_Support *this_local;
  anon_union_8_8_ea4c8939_for_value aVar1;
  
  Am_Input_Char::Am_Input_Char(local_24,in_RDX,false);
  if (local_24[0].code == 0) {
    Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
    aVar1 = extraout_RDX;
  }
  else {
    AVar2 = Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)this);
    aVar1 = AVar2.value;
  }
  AVar2.value.wrapper_value = aVar1.wrapper_value;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

Am_Value From_String(const char *string) const
  {
    Am_Input_Char ch(string, false);
    if (ch.code != 0)
      return ch;
    else
      return Am_No_Value;
  }